

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewAT
          (TransformSelector *this,vector<long,_std::allocator<long>_> *indexes)

{
  TransformSelector *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (TransformSelector *)operator_new(0x40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AT",&local_39);
  anon_unknown.dwarf_a336a3::TransformSelector::TransformSelector(this_00,&local_38);
  (this_00->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorIndexes_00a9f2b0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)(this_00 + 1),indexes);
  std::__cxx11::string::~string((string *)&local_38);
  (this_00->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorIndexes_00a9f240;
  this->_vptr_TransformSelector = (_func_int **)this_00;
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewAT(
  std::vector<index_type> const& indexes)
{
  return cm::make_unique<TransformSelectorAt>(indexes);
}